

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

void * tree_sitter_gdscript_external_scanner_create(void)

{
  undefined8 *payload;
  void *pvVar1;
  
  payload = (undefined8 *)calloc(1,0x10);
  pvVar1 = calloc(1,0x10);
  *payload = pvVar1;
  pvVar1 = calloc(1,0x10);
  payload[1] = pvVar1;
  tree_sitter_gdscript_external_scanner_deserialize(payload,(char *)0x0,0);
  return payload;
}

Assistant:

void *tree_sitter_gdscript_external_scanner_create() {
#if defined(__STDC_VERSION__) && (__STDC_VERSION__ >= 201112L)
    _Static_assert(sizeof(Delimiter) == sizeof(char), "");
#else
    assert(sizeof(Delimiter) == sizeof(char));
#endif
    Scanner *scanner = calloc(1, sizeof(Scanner));
    scanner->indents = calloc(1, sizeof(indent_vec));
    scanner->delimiters = calloc(1, sizeof(delimiter_vec));
    tree_sitter_gdscript_external_scanner_deserialize(scanner, NULL, 0);
    return scanner;
}